

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::PrintTestPartResult(TestPartResult *test_part_result)

{
  Message *pMVar1;
  int in_ECX;
  pointer *__ptr;
  internal *this;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  pointer local_60;
  char *local_58;
  string local_50;
  string local_30;
  
  Message::Message((Message *)&local_68);
  this = (internal *)(test_part_result->file_name_)._M_string_length;
  if (this != (internal *)0x0) {
    this = (internal *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  FormatFileLocation_abi_cxx11_
            (&local_30,this,(char *)(ulong)(uint)test_part_result->line_number_,in_ECX);
  std::operator<<((ostream *)(local_68._M_head_impl + 0x10),(string *)&local_30);
  std::operator<<((ostream *)(local_68._M_head_impl + 0x10)," ");
  if ((ulong)test_part_result->type_ < 4) {
    local_58 = &DAT_00130e44 + *(int *)(&DAT_00130e44 + (ulong)test_part_result->type_ * 4);
  }
  else {
    local_58 = "Unknown result type";
  }
  pMVar1 = Message::operator<<((Message *)&local_68,&local_58);
  local_60 = (test_part_result->message_)._M_dataplus._M_p;
  pMVar1 = Message::operator<<(pMVar1,&local_60);
  Message::GetString_abi_cxx11_(&local_50,pMVar1);
  std::__cxx11::string::_M_dispose();
  if (local_68._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
  puts(local_50._M_dataplus._M_p);
  fflush(_stdout);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

static void PrintTestPartResult(const TestPartResult& test_part_result) {
  const std::string& result = PrintTestPartResultToString(test_part_result);
  printf("%s\n", result.c_str());
  fflush(stdout);
  // If the test program runs in Visual Studio or a debugger, the
  // following statements add the test part result message to the Output
  // window such that the user can double-click on it to jump to the
  // corresponding source code location; otherwise they do nothing.
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MOBILE)
  // We don't call OutputDebugString*() on Windows Mobile, as printing
  // to stdout is done by OutputDebugString() there already - we don't
  // want the same message printed twice.
  ::OutputDebugStringA(result.c_str());
  ::OutputDebugStringA("\n");
#endif
}